

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_sqrt(secp256k1_fe *a,secp256k1_fe *k)

{
  int iVar1;
  long in_RSI;
  bool bVar2;
  int v;
  secp256k1_fe r2;
  secp256k1_fe r1;
  secp256k1_fe *in_stack_000001c8;
  secp256k1_fe *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffff88;
  secp256k1_fe *in_stack_ffffffffffffff90;
  
  iVar1 = secp256k1_fe_sqrt(in_stack_000001d0,in_stack_000001c8);
  if ((iVar1 == 0) != (in_RSI == 0)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xc84,"test condition failed: (v == 0) == (k == NULL)");
    abort();
  }
  if (in_RSI != 0) {
    secp256k1_fe_negate_unchecked
              (in_stack_ffffffffffffff90,(secp256k1_fe *)CONCAT44(iVar1,in_stack_ffffffffffffff88),0
              );
    secp256k1_fe_add(in_stack_ffffffffffffff90,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
    secp256k1_fe_add(in_stack_ffffffffffffff90,
                     (secp256k1_fe *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
    secp256k1_fe_normalize((secp256k1_fe *)0x1403ff);
    secp256k1_fe_normalize((secp256k1_fe *)0x140409);
    iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x140413);
    bVar2 = true;
    if (iVar1 == 0) {
      iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x14042a);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests.c"
              ,0xc8b,"test condition failed: secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2)"
             );
      abort();
    }
  }
  return;
}

Assistant:

static void test_sqrt(const secp256k1_fe *a, const secp256k1_fe *k) {
    secp256k1_fe r1, r2;
    int v = secp256k1_fe_sqrt(&r1, a);
    CHECK((v == 0) == (k == NULL));

    if (k != NULL) {
        /* Check that the returned root is +/- the given known answer */
        secp256k1_fe_negate(&r2, &r1, 1);
        secp256k1_fe_add(&r1, k); secp256k1_fe_add(&r2, k);
        secp256k1_fe_normalize(&r1); secp256k1_fe_normalize(&r2);
        CHECK(secp256k1_fe_is_zero(&r1) || secp256k1_fe_is_zero(&r2));
    }
}